

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall
HFactor::btranCall(HFactor *this,vector<double,_std::allocator<double>_> *vector,
                  HighsTimerClock *factor_timer_clock_pointer)

{
  HighsTimerClock *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  HVector *in_RDI;
  HFactor *unaff_retaddr;
  double expected_density;
  HVector *vector_00;
  
  vector_00 = in_RDI;
  HVectorBase<double>::clearScalars((HVectorBase<double> *)&in_RDI[9].packValue);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_RSI,(vector<double,_std::allocator<double>_> *)in_RDX);
  *(undefined4 *)
   ((long)&in_RDI[9].packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0xffffffff;
  btranCall(unaff_retaddr,vector_00,(double)in_RSI,in_RDX);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_RSI,(vector<double,_std::allocator<double>_> *)in_RDX);
  return;
}

Assistant:

void HFactor::btranCall(std::vector<double>& vector,
                        HighsTimerClock* factor_timer_clock_pointer) {
  // Only have to clear the scalars of the local HVector, since the
  // array is moved in. Set the count to -1 to indicate that indices
  // aren't known.
  this->rhs_.clearScalars();
  this->rhs_.array = std::move(vector);
  this->rhs_.count = -1;
  const double expected_density = 1;
  btranCall(this->rhs_, expected_density, factor_timer_clock_pointer);
  vector = std::move(this->rhs_.array);
}